

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::closeBeamlet
          (ApertureILS *this,int beamlet,int side,int aperture,Station *station,double c_eval,
          Plan *P)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  size_t *psVar3;
  int beam;
  double dVar4;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_78;
  int local_60;
  int local_5c;
  _List_node_base local_58;
  size_t local_48;
  double local_40;
  double local_38;
  
  local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
  local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
  local_5c = aperture;
  local_40 = c_eval;
  dVar4 = Station::getApertureIntensity(station,aperture);
  dVar4 = EvaluationFunction::get_delta_eval
                    (P->ev,station->angle,beamlet,-dVar4,&P->w,&P->Zmin,&P->Zmax,999999);
  if (local_40 < dVar4) {
    Station::clearHistory(station);
    p_Var2 = local_78.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    goto joined_r0x0012910d;
  }
  psVar3 = &local_78.
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size;
  local_60 = beamlet;
  if (side == 2) {
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58,
               station,beamlet,local_5c,false);
    p_Var2 = local_78.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&local_78) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node._M_size = 0;
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
    if (local_58._M_next != &local_58) {
      psVar3 = &local_48;
      (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
      (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = local_48;
      local_58._M_next = &local_58;
      local_58._M_prev = &local_58;
    }
    *psVar3 = 0;
    p_Var2 = local_58._M_next;
    while (p_Var2 != &local_58) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
LAB_001290e7:
    p_Var2 = local_78.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size == 0) goto joined_r0x0012910d;
  }
  else {
    if (side == 1) {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58
                 ,station,beamlet,local_5c,true);
      p_Var2 = local_78.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var2 != (_List_node_base *)&local_78) {
        p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
      if (local_58._M_next != &local_58) {
        psVar3 = &local_48;
        (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
        (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_48;
        local_58._M_next = &local_58;
        local_58._M_prev = &local_58;
      }
      *psVar3 = 0;
      p_Var2 = local_58._M_next;
      while (p_Var2 != &local_58) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      goto LAB_001290e7;
    }
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58,
               station,beamlet,local_5c,true);
    p_Var2 = local_78.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    beam = local_60;
    while (local_60 = beam, p_Var2 != (_List_node_base *)&local_78) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
      beam = local_60;
    }
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node._M_size = 0;
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
    if (local_58._M_next != &local_58) {
      psVar3 = &local_48;
      (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
      (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = local_48;
      local_58._M_next = &local_58;
      local_58._M_prev = &local_58;
    }
    *psVar3 = 0;
    p_Var2 = local_58._M_next;
    while (p_Var2 != &local_58) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    local_38 = local_40;
    if (local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      local_38 = Plan::incremental_eval(P,station,&local_78);
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58
                 ,station);
      p_Var2 = local_78.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var2 != (_List_node_base *)&local_78) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_58._M_next == &local_58) {
        psVar3 = &local_78.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
      }
      else {
        psVar3 = &local_48;
        (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
        (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_48;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
        local_58._M_next = &local_58;
        local_58._M_prev = &local_58;
      }
      *psVar3 = 0;
      p_Var2 = local_58._M_next;
      while (p_Var2 != &local_58) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      Plan::incremental_eval(P,station,&local_78);
      beam = local_60;
    }
    Station::closeBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58,
               station,beam,local_5c,false);
    p_Var2 = local_78.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&local_78) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node._M_size = 0;
    if (local_58._M_next == &local_58) {
      psVar3 = &local_78.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node._M_size;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
    }
    else {
      psVar3 = &local_48;
      (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
      (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = local_48;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
      local_58._M_next = &local_58;
      local_58._M_prev = &local_58;
    }
    *psVar3 = 0;
    p_Var2 = local_58._M_next;
    while (p_Var2 != &local_58) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    if (local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      local_40 = Plan::incremental_eval(P,station,&local_78);
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58
                 ,station);
      p_Var2 = local_78.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var2 != (_List_node_base *)&local_78) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_58._M_next == &local_58) {
        psVar3 = &local_78.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
      }
      else {
        psVar3 = &local_48;
        (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
        (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_48;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
        local_58._M_next = &local_58;
        local_58._M_prev = &local_58;
      }
      *psVar3 = 0;
      p_Var2 = local_58._M_next;
      while (p_Var2 != &local_58) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      Plan::incremental_eval(P,station,&local_78);
    }
    if (local_40 <= local_38) {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58
                 ,station,local_60,local_5c,false);
      p_Var2 = local_78.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var2 != (_List_node_base *)&local_78) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_58._M_next == &local_58) {
        psVar3 = &local_78.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
      }
      else {
        psVar3 = &local_48;
        (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
        (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_48;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
        local_58._M_next = &local_58;
        local_58._M_prev = &local_58;
      }
      *psVar3 = 0;
      p_Var2 = local_58._M_next;
      while (p_Var2 != &local_58) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
    }
    else {
      Station::closeBeamlet_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_58
                 ,station,local_60,local_5c,true);
      p_Var2 = local_78.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      while (p_Var2 != (_List_node_base *)&local_78) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
      local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = 0;
      if (local_58._M_next == &local_58) {
        psVar3 = &local_78.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node._M_size;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
      }
      else {
        psVar3 = &local_48;
        (local_58._M_prev)->_M_next = (_List_node_base *)&local_78;
        (local_58._M_next)->_M_prev = (_List_node_base *)&local_78;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size = local_48;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_next = local_58._M_next;
        local_78.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev = local_58._M_prev;
        local_58._M_next = &local_58;
        local_58._M_prev = &local_58;
      }
      *psVar3 = 0;
      p_Var2 = local_58._M_next;
      while (p_Var2 != &local_58) {
        p_Var1 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var1;
      }
    }
  }
  local_40 = Plan::incremental_eval(P,station,&local_78);
  p_Var2 = local_78.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
joined_r0x0012910d:
  while (p_Var2 != (_List_node_base *)&local_78) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  return local_40;
}

Assistant:

double ApertureILS::closeBeamlet(int beamlet, int side, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval, l_eval, r_eval;
  list <pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, -station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }
  
  if (side == 1) {
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    } 
  } else if (side==2) {
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      c_eval = P.incremental_eval(station, diff);
    }
  } else {
    l_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, true);
    if (diff.size() > 0) {
      l_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    r_eval = c_eval;
    diff = station.closeBeamlet(beamlet, aperture, false);
    if (diff.size() > 0) {
      r_eval = P.incremental_eval(station, diff);
      diff = station.undoLast();
      aux_eval = P.incremental_eval(station, diff);
    }
    
    if (r_eval > l_eval){
      diff = station.closeBeamlet(beamlet, aperture, true);
      c_eval = P.incremental_eval(station, diff);
    } else {
      diff = station.closeBeamlet(beamlet, aperture, false);
      c_eval = P.incremental_eval(station, diff);
    }
  }
  return(c_eval);
}